

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::emitCatchAll(BinaryInstWriter *this,Try *curr)

{
  WasmBinaryWriter *this_00;
  Function *func;
  size_t id;
  Try *curr_local;
  BinaryInstWriter *this_local;
  
  if ((this->func != (Function *)0x0) && ((this->sourceMap & 1U) == 0)) {
    this_00 = this->parent;
    func = this->func;
    id = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                   (&(curr->catchBodies).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    WasmBinaryWriter::writeExtraDebugLocation(this_00,(Expression *)curr,func,id);
  }
  BufferWithRandomAccess::operator<<(this->o,'\x19');
  return;
}

Assistant:

void BinaryInstWriter::emitCatchAll(Try* curr) {
  if (func && !sourceMap) {
    parent.writeExtraDebugLocation(curr, func, curr->catchBodies.size());
  }
  o << int8_t(BinaryConsts::CatchAll_Legacy);
}